

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  int fd;
  _func_int **in_RAX;
  int *piVar1;
  WritableFile WVar2;
  char *in_RSI;
  Status status;
  WritableFile local_28;
  
  local_28._vptr_WritableFile = in_RAX;
  if (in_RSI[0x10014] == '\x01') {
    fd = open(*(char **)(in_RSI + 0x10038),0x80000);
    if (fd < 0) {
      piVar1 = __errno_location();
      PosixError((anon_unknown_1 *)&stack0xffffffffffffffd8,(string *)(in_RSI + 0x10038),*piVar1);
      WVar2._vptr_WritableFile = local_28._vptr_WritableFile;
    }
    else {
      SyncFd((PosixWritableFile *)&stack0xffffffffffffffd8,fd,(string *)(in_RSI + 0x10038));
      WVar2._vptr_WritableFile = local_28._vptr_WritableFile;
      close(fd);
    }
  }
  else {
    WVar2._vptr_WritableFile = (_func_int **)0x0;
  }
  if (WVar2._vptr_WritableFile == (_func_int **)0x0) {
    WriteUnbuffered((PosixWritableFile *)&stack0xffffffffffffffd8,in_RSI,(size_t)(in_RSI + 8));
    in_RSI[0x10008] = '\0';
    in_RSI[0x10009] = '\0';
    in_RSI[0x1000a] = '\0';
    in_RSI[0x1000b] = '\0';
    in_RSI[0x1000c] = '\0';
    in_RSI[0x1000d] = '\0';
    in_RSI[0x1000e] = '\0';
    in_RSI[0x1000f] = '\0';
    WVar2._vptr_WritableFile = local_28._vptr_WritableFile;
    if (local_28._vptr_WritableFile == (_func_int **)0x0) {
      SyncFd(this,*(int *)(in_RSI + 0x10010),(string *)(in_RSI + 0x10018));
      return (Status)(char *)this;
    }
  }
  (this->super_WritableFile)._vptr_WritableFile = WVar2._vptr_WritableFile;
  return (Status)(char *)this;
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_);
  }